

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.h
# Opt level: O2

size_t __thiscall rtc::Buffer::size(Buffer *this)

{
  bool bVar1;
  ostream *poVar2;
  FatalMessage local_180;
  
  bVar1 = IsConsistent(this);
  if (bVar1) {
    return this->size_;
  }
  FatalMessage::FatalMessage
            (&local_180,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/buffer.h"
             ,0x5c);
  poVar2 = std::operator<<((ostream *)&local_180,"Check failed: IsConsistent()");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::operator<<(poVar2,"# ");
  FatalMessage::~FatalMessage(&local_180);
}

Assistant:

size_t size() const {
    RTC_DCHECK(IsConsistent());
    return size_;
  }